

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::dht_put_mutable_item
          (session_impl *this,array<char,_32UL> key,
          function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *cb,string *salt)

{
  dht_tracker *this_00;
  _Manager_type p_Var1;
  string sStack_d8;
  function<void_(libtorrent::dht::item_&)> local_b8;
  function<void_(const_libtorrent::dht::item_&,_int)> local_98;
  public_key local_78;
  _Bind<void_(*(std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>))(libtorrent::dht::item_&,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>)>
  local_58;
  _Bind<void_(*(std::reference_wrapper<libtorrent::aux::alert_manager>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::alert_manager_&,_const_libtorrent::dht::item_&,_int)>
  local_30;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_78.bytes._M_elems[0x10] = key._M_elems[0x10];
    local_78.bytes._M_elems[0x11] = key._M_elems[0x11];
    local_78.bytes._M_elems[0x12] = key._M_elems[0x12];
    local_78.bytes._M_elems[0x13] = key._M_elems[0x13];
    local_78.bytes._M_elems[0x14] = key._M_elems[0x14];
    local_78.bytes._M_elems[0x15] = key._M_elems[0x15];
    local_78.bytes._M_elems[0x16] = key._M_elems[0x16];
    local_78.bytes._M_elems[0x17] = key._M_elems[0x17];
    local_78.bytes._M_elems[0x18] = key._M_elems[0x18];
    local_78.bytes._M_elems[0x19] = key._M_elems[0x19];
    local_78.bytes._M_elems[0x1a] = key._M_elems[0x1a];
    local_78.bytes._M_elems[0x1b] = key._M_elems[0x1b];
    local_78.bytes._M_elems[0x1c] = key._M_elems[0x1c];
    local_78.bytes._M_elems[0x1d] = key._M_elems[0x1d];
    local_78.bytes._M_elems[0x1e] = key._M_elems[0x1e];
    local_78.bytes._M_elems[0x1f] = key._M_elems[0x1f];
    local_78.bytes._M_elems[0] = key._M_elems[0];
    local_78.bytes._M_elems[1] = key._M_elems[1];
    local_78.bytes._M_elems[2] = key._M_elems[2];
    local_78.bytes._M_elems[3] = key._M_elems[3];
    local_78.bytes._M_elems[4] = key._M_elems[4];
    local_78.bytes._M_elems[5] = key._M_elems[5];
    local_78.bytes._M_elems[6] = key._M_elems[6];
    local_78.bytes._M_elems[7] = key._M_elems[7];
    local_78.bytes._M_elems[8] = key._M_elems[8];
    local_78.bytes._M_elems[9] = key._M_elems[9];
    local_78.bytes._M_elems[10] = key._M_elems[10];
    local_78.bytes._M_elems[0xb] = key._M_elems[0xb];
    local_78.bytes._M_elems[0xc] = key._M_elems[0xc];
    local_78.bytes._M_elems[0xd] = key._M_elems[0xd];
    local_78.bytes._M_elems[0xe] = key._M_elems[0xe];
    local_78.bytes._M_elems[0xf] = key._M_elems[0xf];
    local_30._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .super__Head_base<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_false>.
    _M_head_impl._M_data =
         (_Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          )&this->m_alerts;
    local_30._M_f = anon_unknown_119::on_dht_put_mutable_item;
    ::std::function<void(libtorrent::dht::item_const&,int)>::
    function<std::_Bind<void(*(std::reference_wrapper<libtorrent::aux::alert_manager>,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::aux::alert_manager&,libtorrent::dht::item_const&,int)>,void>
              ((function<void(libtorrent::dht::item_const&,int)> *)&local_98,&local_30);
    local_58._M_f = anon_unknown_119::put_mutable_callback;
    local_58._M_bound_args.
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_58._M_bound_args.
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor._8_8_ = 0;
    local_58._M_bound_args.
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_manager = (_Manager_type)0x0;
    local_58._M_bound_args.
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
    ._M_head_impl._M_invoker = cb->_M_invoker;
    p_Var1 = (cb->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_58._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
      ._M_head_impl.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
      local_58._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
      ._M_head_impl.super__Function_base._M_functor._8_8_ =
           *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
      (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
      cb->_M_invoker = (_Invoker_type)0x0;
      local_58._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
      ._M_head_impl.super__Function_base._M_manager = p_Var1;
    }
    ::std::function<void(libtorrent::dht::item&)>::
    function<std::_Bind<void(*(std::_Placeholder<1>,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>))(libtorrent::dht::item&,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>)>,void>
              ((function<void(libtorrent::dht::item&)> *)&local_b8,&local_58);
    ::std::__cxx11::string::string((string *)&sStack_d8,(string *)salt);
    libtorrent::dht::dht_tracker::put_item(this_00,&local_78,&local_98,&local_b8,&sStack_d8);
    ::std::__cxx11::string::~string((string *)&sStack_d8);
    ::std::_Function_base::~_Function_base(&local_b8.super__Function_base);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_58._M_bound_args);
    ::std::_Function_base::~_Function_base(&local_98.super__Function_base);
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}